

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::Texture2DMultisampleTargetIsRejectedTest::iterate
          (Texture2DMultisampleTargetIsRejectedTest *this)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  TestError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar1;
  if (!bVar1) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "OES_texture_storage_multisample_2d_array";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_00c0bfca:
    tcu::TestContext::setTestResult(this_01,testResult,description);
    return STOP;
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  initInternals(this);
  if (this->to_id == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Texture object has not been generated.","to_id != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,0x442);
  }
  else {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x13a8))
              (0x9100,1,0x8058,1,1,1,in_RAX & 0xffffffff00000000);
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    if (iVar2 == 0x500) {
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00c0bfca;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"gltexStorage3DMultisample() did not generate GL_INVALID_ENUM error.",
               "gl.getError() == GL_INVALID_ENUM",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,0x449);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult Texture2DMultisampleTargetIsRejectedTest::iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture object was generated properly. */
	TCU_CHECK_MSG(to_id != 0, "Texture object has not been generated.");

	/* Call gltexStorage3DMultisample() with invalid GL_TEXTURE_2D_MULTISAMPLE texture target argument. */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE, /* invalid texture target */ 1, GL_RGBA8, 1, 1, 1, GL_FALSE);

	/* Expect GL_INVALID_ENUM error code. */
	TCU_CHECK_MSG(gl.getError() == GL_INVALID_ENUM,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_ENUM error.");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}